

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetPropertyComputer.cxx
# Opt level: O2

bool cmTargetPropertyComputer::HandleLocationPropertyPolicy
               (string *tgtName,cmMessenger *messenger,cmListFileBacktrace *context)

{
  PolicyStatus PVar1;
  ostream *poVar2;
  PolicyID id;
  bool bVar3;
  MessageType t;
  char *pcVar4;
  string local_1c8;
  ostringstream e;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
  local_1c8.field_2._M_allocated_capacity = (context->Bottom).Position.Position;
  local_1c8._M_dataplus._M_p = (pointer)(context->Bottom).State;
  local_1c8._M_string_length = (size_type)(context->Bottom).Position.Tree;
  PVar1 = cmStateSnapshot::GetPolicy((cmStateSnapshot *)&local_1c8,CMP0026);
  if (PVar1 - NEW < 3) {
    t = FATAL_ERROR;
    pcVar4 = "may";
    bVar3 = false;
  }
  else {
    bVar3 = true;
    if (PVar1 != WARN) goto LAB_0033fb7f;
    cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1c8,(cmPolicies *)0x1a,id);
    poVar2 = std::operator<<((ostream *)&e,(string *)&local_1c8);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string((string *)&local_1c8);
    t = AUTHOR_WARNING;
    bVar3 = true;
    pcVar4 = "should";
  }
  poVar2 = std::operator<<((ostream *)&e,"The LOCATION property ");
  poVar2 = std::operator<<(poVar2,pcVar4);
  poVar2 = std::operator<<(poVar2," not be read from target \"");
  poVar2 = std::operator<<(poVar2,(string *)tgtName);
  std::operator<<(poVar2,
                  "\".  Use the target name directly with add_custom_command, or use the generator expression $<TARGET_FILE>, as appropriate.\n"
                 );
  std::__cxx11::stringbuf::str();
  cmMessenger::IssueMessage(messenger,t,&local_1c8,context);
  std::__cxx11::string::~string((string *)&local_1c8);
LAB_0033fb7f:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
  return bVar3;
}

Assistant:

bool cmTargetPropertyComputer::HandleLocationPropertyPolicy(
  std::string const& tgtName, cmMessenger* messenger,
  cmListFileBacktrace const& context)
{
  std::ostringstream e;
  const char* modal = CM_NULLPTR;
  cmake::MessageType messageType = cmake::AUTHOR_WARNING;
  switch (context.GetBottom().GetPolicy(cmPolicies::CMP0026)) {
    case cmPolicies::WARN:
      e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0026) << "\n";
      modal = "should";
    case cmPolicies::OLD:
      break;
    case cmPolicies::REQUIRED_ALWAYS:
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::NEW:
      modal = "may";
      messageType = cmake::FATAL_ERROR;
  }

  if (modal) {
    e << "The LOCATION property " << modal << " not be read from target \""
      << tgtName
      << "\".  Use the target name directly with "
         "add_custom_command, or use the generator expression $<TARGET_FILE>, "
         "as appropriate.\n";
    messenger->IssueMessage(messageType, e.str(), context);
  }

  return messageType != cmake::FATAL_ERROR;
}